

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O1

void parout(void)

{
  short *psVar1;
  Symbol *pSVar2;
  ushort uVar3;
  Item *item;
  int iVar4;
  uint uVar15;
  int iVar5;
  Symbol *pSVar6;
  Item *pIVar7;
  Item *pIVar8;
  Item *pIVar9;
  List *pLVar10;
  char *pcVar11;
  List **ppLVar12;
  List *pLVar13;
  short sVar14;
  Symbol *s;
  ulong uVar16;
  bool bVar17;
  char *__format;
  long lVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  bool bVar24;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  ulong local_c0;
  double d1_1;
  double d2;
  Item *local_a8;
  double d2_1;
  double d1;
  
  cvode_emit = 0;
  defs_list = newlist();
  pcVar11 = "nrn_cur, NULL, nrn_state";
  if (vectorize == 0) {
    pcVar11 = "nrn_cur, nrn_jacob, nrn_state";
  }
  brkpnt_str_ = "NULL, NULL, NULL";
  if (brkpnt_exists != 0) {
    brkpnt_str_ = pcVar11;
  }
  set_suffix();
  if (((artificial_cell != 0) && (vectorize != 0)) &&
     ((thread_data_index != 0 || (toplocal_ != (List *)0x0)))) {
    parout_cold_1();
  }
  pIVar7 = net_receive_block_begin_;
  rsuffix = "";
  if (point_process == 0) {
    rsuffix = suffix;
  }
  else if ((artificial_cell == 0) && (net_receive_ != 0)) {
    net_receive_buffering_ = 1;
    insertstr(net_receive_block_begin_,"\n#if NET_RECEIVE_BUFFERING");
    memcpy(buf,
           "\n#undef t\n#define t _nrb_t\nstatic inline void _net_receive_kernel(NrnThread*, double, Point_process*, int _weight_index, double _flag);\nvoid _net_buf_receive(NrnThread* _nt) {\n  if (!_nt->_ml_list) { return; }\n  Memb_list* _ml = _nt->_ml_list[_mechtype];\n  if (!_ml) { return; }\n  NetReceiveBuffer_t* _nrb = _ml->_net_receive_buffer;"
           ,0x14e);
    insertstr(pIVar7,buf);
    sprintf(buf,
            "\n  int _di;\n  int stream_id = _nt->stream_id;\n  Point_process* _pnt = _nt->pntprocs;\n  int _pnt_length = _nt->n_pntproc - _nrb->_pnt_offset;\n  int _displ_cnt = _nrb->_displ_cnt;\n  _PRAGMA_FOR_NETRECV_ACC_LOOP_ \n  for (_di = 0; _di < _displ_cnt; ++_di) {\n    int _inrb;\n    int _di0 = _nrb->_displ[_di];\n    int _di1 = _nrb->_displ[_di + 1];\n    for (_inrb = _di0; _inrb < _di1; ++_inrb) {\n      int _i = _nrb->_nrb_index[_inrb];\n      int _j = _nrb->_pnt_index[_i];\n      int _k = _nrb->_weight_index[_i];\n      double _nrt = _nrb->_nrb_t[_i];\n      double _nrflag = _nrb->_nrb_flag[_i];\n      _net_receive_kernel(nrn_threads, _nrt, _pnt + _j, _k, _nrflag);\n    }\n  }\n  #pragma acc wait(stream_id)\n  _nrb->_displ_cnt = 0;\n  _nrb->_cnt = 0;\n  /*printf(\"_net_buf_receive_%s  %%d\\n\", _nt->_id);*/\n"
            ,suffix);
    insertstr(pIVar7,buf);
    if (net_event_seen_ != 0 || net_send_seen_ != 0) {
      memcpy(buf,
             "\n  {\n  NetSendBuffer_t* _nsb = _ml->_net_send_buffer;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update self(_nsb->_cnt) if(_nt->compute_gpu)\n  update_net_send_buffer_on_host(_nt, _nsb);\n#endif\n  int _i;\n  for (_i=0; _i < _nsb->_cnt; ++_i) {\n    net_sem_from_gpu(_nsb->_sendtype[_i], _nsb->_vdata_index[_i],\n      _nsb->_weight_index[_i], _nt->_id, _nsb->_pnt_index[_i],\n      _nsb->_nsb_t[_i], _nsb->_nsb_flag[_i]);\n  }\n  _nsb->_cnt = 0;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update device(_nsb->_cnt) if (_nt->compute_gpu)\n#endif\n  }\n"
             ,0x24a);
      insertstr(pIVar7,buf);
    }
    insertstr(pIVar7,"\n}\n");
    if (net_event_seen_ != 0 || net_send_seen_ != 0) {
      memcpy(buf,
             "\nstatic void _net_send_buffering(NetSendBuffer_t* _nsb, int _sendtype, int _i_vdata, int _weight_index,\n int _ipnt, double _t, double _flag) {\n  int _i = 0;\n  #pragma acc atomic capture\n  {\n    _i = _nsb->_cnt++;\n  }\n#if !defined(_OPENACC)\n  if (_i >= _nsb->_size) {\n    _nsb->grow();\n  }\n#endif\n  if (_i < _nsb->_size) {\n    _nsb->_sendtype[_i] = _sendtype;\n    _nsb->_vdata_index[_i] = _i_vdata;\n    _nsb->_weight_index[_i] = _weight_index;\n    _nsb->_pnt_index[_i] = _ipnt;\n    _nsb->_nsb_t[_i] = _t;\n    _nsb->_nsb_flag[_i] = _flag;\n  }\n}\n"
             ,0x220);
      insertstr(pIVar7,buf);
    }
    memcpy(buf,
           "\nvoid _net_receive (Point_process* _pnt, int _weight_index, double _lflag) {\n  NrnThread* _nt = nrn_threads + _pnt->_tid;\n  NetReceiveBuffer_t* _nrb = _nt->_ml_list[_mechtype]->_net_receive_buffer;\n  if (_nrb->_cnt >= _nrb->_size){\n    realloc_net_receive_buffer(_nt, _nt->_ml_list[_mechtype]);\n  }\n  _nrb->_pnt_index[_nrb->_cnt] = _pnt - _nt->pntprocs;\n  _nrb->_weight_index[_nrb->_cnt] = _weight_index;\n  _nrb->_nrb_t[_nrb->_cnt] = _nt->_t;\n  _nrb->_nrb_flag[_nrb->_cnt] = _lflag;\n  ++_nrb->_cnt;\n}\n"
           ,0x1f6);
    insertstr(pIVar7,buf);
    memcpy(buf,
           "\nstatic void _net_receive_kernel(NrnThread* nrn_threads, double _nrb_t, Point_process* _pnt, int _weight_index, double _lflag)\n#else\n"
           ,0x86);
    insertstr(pIVar7,buf);
    insertstr(net_receive_block_open_brace_,"\n#endif\n");
  }
  lappendstr(defs_list,
             "\n#include \"coreneuron/utils/randoms/nrnran123.h\"\n#include \"coreneuron/nrnoc/md1redef.h\"\n#include \"coreneuron/nrnconf.h\"\n#include \"coreneuron/sim/multicore.hpp\"\n#include \"coreneuron/nrniv/nrniv_decl.h\"\n#include \"coreneuron/utils/ivocvect.hpp\"\n#include \"coreneuron/utils/nrnoc_aux.hpp\"\n#include \"coreneuron/gpu/nrn_acc_manager.hpp\"\n#include \"coreneuron/sim/scopmath/newton_struct.h\"\n#include \"coreneuron/sim/scopmath/newton_thread.hpp\"\n#include \"coreneuron/sim/scopmath/sparse_thread.hpp\"\n#include \"coreneuron/sim/scopmath/ssimplic_thread.hpp\"\n#include \"coreneuron/nrnoc/md2redef.h\"\n#include \"coreneuron/mechanism/register_mech.hpp\"\n#if !NRNGPU\n#if !defined(DISABLE_HOC_EXP)\n#undef exp\n#define exp hoc_Exp\n#endif\n#endif\n"
            );
  if (use_bbcorepointer == '\x01') {
    lappendstr(defs_list,
               "#define _threadargsproto_namespace int _iml, int _cntml_padded, double* _p, coreneuron::Datum* _ppvar, coreneuron::ThreadDatum* _thread, coreneuron::NrnThread* _nt, coreneuron::Memb_list* _ml, double v\n"
              );
    lappendstr(defs_list,
               "static void bbcore_read(double *, int*, int*, int*, _threadargsproto_namespace);\n")
    ;
    lappendstr(defs_list,
               "static void bbcore_write(double *, int*, int*, int*, _threadargsproto_namespace);\n"
              );
  }
  lappendstr(defs_list,"namespace coreneuron {\n");
  if (vectorize == 0) {
    local_a8 = lappendstr(defs_list,"\n#undef LAYOUT\n#define LAYOUT 1\n#define _STRIDE 1\n");
  }
  else {
    lappendstr(defs_list,
               "\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n#include <openacc.h>\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], nrn_ion_global_map[0:nrn_ion_global_map_size][0:ion_global_map_member_size], _nt[0:1] _thread_present_) if(_nt->compute_gpu)\")\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _nt[0:1], _ml[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_shadow_rhs[0:_nt->shadow_rhs_cnt], _vec_shadow_d[0:_nt->shadow_rhs_cnt], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1]) if(_nt->compute_gpu) async(stream_id)\")\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"acc parallel loop present(_pnt[0:_pnt_length], _nrb[0:1], _nt[0:1], nrn_threads[0:nrn_nthread]) if(_nt->compute_gpu) async(stream_id)\")\n#else\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"\")\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"\")\n#endif\n \n#if !defined(LAYOUT)\n/* 1 means AoS, >1 means AoSoA, <= 0 means SOA */\n#define LAYOUT 1\n#endif\n#if LAYOUT >= 1\n#define _STRIDE LAYOUT\n#else\n#define _STRIDE _cntml_padded + _iml\n#endif\n"
              );
    if (protect_include_ == 0) {
      pcVar11 = 
      "\n\n#if defined(__ICC) || defined(__INTEL_COMPILER) || defined(__INTEL_LLVM_COMPILER)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ivdep\")\n#elif defined(__IBMC__) || defined(__IBMCPP__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ibm independent_loop\")\n#elif defined(__PGI)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"vector\")\n#elif defined(_CRAYC)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"_CRI ivdep\")\n#elif defined(__clang__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"clang loop vectorize(enable)\")\n#elif defined(__GNUC__) || defined(__GNUG__)\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"GCC ivdep\")\n#else\n#define _PRAGMA_FOR_VECTOR_LOOP_\n#endif // _PRAGMA_FOR_VECTOR_LOOP_\n"
      ;
    }
    else {
      pcVar11 = "\n#define _PRAGMA_FOR_VECTOR_LOOP_\n";
    }
    local_a8 = insertstr(defs_list,pcVar11);
  }
  if (net_receive_buffering_ != 0) {
    lappendstr(defs_list,
               "\n\n#if !defined(NET_RECEIVE_BUFFERING)\n#define NET_RECEIVE_BUFFERING 1\n#endif\n")
    ;
  }
  sprintf(buf,
          "\n#define nrn_init _nrn_init_%s\n#define nrn_cur _nrn_cur_%s\n#define _nrn_current _nrn_current_%s\n#define nrn_jacob _nrn_jacob_%s\n#define nrn_state _nrn_state_%s\n#define initmodel initmodel_%s\n#define _net_receive _net_receive_%s\n#define _net_init _net_init_%s\n#define nrn_state_launcher nrn_state%s_launcher\n#define nrn_cur_launcher nrn_cur%s_launcher\n#define nrn_jacob_launcher nrn_jacob%s_launcher"
          ,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix,suffix);
  lappendstr(defs_list,buf);
  if (net_receive_buffering_ != 0) {
    sprintf(buf,
            "\n#if NET_RECEIVE_BUFFERING\n#define _net_buf_receive _net_buf_receive%s\nvoid _net_buf_receive(NrnThread*);\n#endif\n"
            ,suffix);
    lappendstr(defs_list,buf);
  }
  if (watch_seen_ != 0) {
    sprintf(buf,"\n#define _nrn_watch_check _nrn_watch_check_%s",suffix);
    lappendstr(defs_list,buf);
  }
  lVar18 = 0x41;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        pIVar7 = (pLVar10->element).itm;
        if ((pIVar7->itemtype == 0x13e) && (((ulong)pIVar7->element & 0x680) != 0)) {
          sprintf(buf,"\n#define %s %s%s",pIVar7[2].element.itm);
          lappendstr(defs_list,buf);
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  lappendstr(defs_list,"\n");
  lappendstr(defs_list,
             "\n#undef _threadargscomma_\n#undef _threadargsprotocomma_\n#undef _threadargs_\n#undef _threadargsproto_\n"
            );
  pcVar11 = 
  "\n#define _threadargscomma_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v,\n#define _threadargsprotocomma_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v,\n#define _threadargs_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v\n#define _threadargsproto_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v\n"
  ;
  if (vectorize == 0) {
    pcVar11 = 
    "\n#define _threadargscomma_ /**/\n#define _threadargsprotocomma_ /**/\n#define _threadargs_ /**/\n#define _threadargsproto_ /**/\n"
    ;
  }
  lappendstr(defs_list,pcVar11);
  lappendstr(defs_list,
             "\t/*SUPPRESS 761*/\n\t/*SUPPRESS 762*/\n\t/*SUPPRESS 763*/\n\t/*SUPPRESS 765*/\n\t");
  if (vectorize == 0) {
    builtin_strncpy(buf + 0x20,"*_ppvar;\n",10);
    buf[0x10] = 'p';
    buf[0x11] = ';';
    builtin_strncpy(buf + 0x1a,"Datum ",6);
    uVar26._0_1_ = 's';
    uVar26._1_1_ = 't';
    uVar26._2_1_ = 'a';
    uVar26._3_1_ = 't';
    uVar27._0_1_ = 'i';
    uVar27._1_1_ = 'c';
    uVar27._2_1_ = ' ';
    uVar27._3_1_ = 'd';
    uVar28._0_1_ = 'o';
    uVar28._1_1_ = 'u';
    uVar28._2_1_ = 'b';
    uVar28._3_1_ = 'l';
    uVar29._0_1_ = 'e';
    uVar29._1_1_ = ' ';
    uVar29._2_1_ = '*';
    uVar29._3_1_ = '_';
  }
  else {
    builtin_strncpy(buf + 0x20,"_ppvar. */\n",0xc);
    buf[0x10] = 'N';
    buf[0x11] = 'o';
    builtin_strncpy(buf + 0x1a,"_p or ",6);
    uVar26._0_1_ = '/';
    uVar26._1_1_ = '*';
    uVar26._2_1_ = ' ';
    uVar26._3_1_ = 'T';
    uVar27._0_1_ = 'h';
    uVar27._1_1_ = 'r';
    uVar27._2_1_ = 'e';
    uVar27._3_1_ = 'a';
    uVar28._0_1_ = 'd';
    uVar28._1_1_ = ' ';
    uVar28._2_1_ = 's';
    uVar28._3_1_ = 'a';
    uVar29._0_1_ = 'f';
    uVar29._1_1_ = 'e';
    uVar29._2_1_ = '.';
    uVar29._3_1_ = ' ';
  }
  builtin_strncpy(buf + 0x12," static ",8);
  buf[4] = (char)uVar27;
  buf[5] = SUB41(uVar27,1);
  buf[6] = SUB41(uVar27,2);
  buf[7] = SUB41(uVar27,3);
  buf[0] = (char)uVar26;
  buf[1] = SUB41(uVar26,1);
  buf[2] = SUB41(uVar26,2);
  buf[3] = SUB41(uVar26,3);
  buf._8_2_ = (undefined2)uVar28;
  buf._10_2_ = SUB42(uVar28,2);
  buf._12_2_ = (undefined2)uVar29;
  buf._14_2_ = SUB42(uVar29,2);
  lappendstr(defs_list,buf);
  pSVar6 = lookup("diam");
  if (pSVar6 != (Symbol *)0x0) {
    if ((pSVar6->nrntype & 0x48) != 0) {
      diag(pSVar6->name," cannot be a RANGE or GLOBAL variable for this mechanism");
    }
    pSVar6->nrntype = pSVar6->nrntype | 0x110;
    diamdec = 1;
  }
  pSVar6 = lookup("area");
  if (pSVar6 != (Symbol *)0x0) {
    if ((pSVar6->nrntype & 0x48) != 0) {
      diag(pSVar6->name," cannot be a RANGE or GLOBAL variable for this mechanism");
    }
    pSVar6->nrntype = pSVar6->nrntype | 0x110;
    areadec = 1;
  }
  iVar23 = vectorize;
  pSVar6 = lookup("v");
  if (iVar23 == 0) {
    if (pSVar6 == (Symbol *)0x0) {
      pSVar6 = install("v",0x13e);
      parminstall(pSVar6,"0","","");
    }
    pSVar6->nrntype = pSVar6->nrntype | 0x180;
  }
  else {
    if (pSVar6 == (Symbol *)0x0) {
      pSVar6 = install("v",0x13e);
      parminstall(pSVar6,"0","","");
    }
    pSVar6->nrntype = 0x100;
  }
  pSVar6 = lookup("t");
  if (pSVar6 == (Symbol *)0x0) {
    pSVar6 = install("t",0x13e);
    parminstall(pSVar6,"0","","");
  }
  pSVar6->nrntype = pSVar6->nrntype | 0x101;
  pSVar6 = lookup("dt");
  if (pSVar6 == (Symbol *)0x0) {
    pSVar6 = install("dt",0x13e);
    parminstall(pSVar6,"0","","");
  }
  pSVar6->nrntype = pSVar6->nrntype | 0x101;
  pIVar7 = lappendstr(defs_list,"\n#define t nrn_threads->_t\n#define dt nrn_threads->_dt\n");
  vectorize_substitute(pIVar7,"\n#define t _nt->_t\n#define dt _nt->_dt\n");
  pSVar6 = lookup("usetable");
  if (pSVar6 != (Symbol *)0x0) {
    pSVar6->nrntype = pSVar6->nrntype | 0x140;
  }
  pSVar6 = lookup("celsius");
  if (pSVar6 != (Symbol *)0x0) {
    pSVar6->nrntype = pSVar6->nrntype | 0x101;
  }
  pSVar6 = lookup("celcius");
  if (pSVar6 != (Symbol *)0x0) {
    diag("celcius should be spelled celsius",(char *)0x0);
  }
  pIVar7 = syminorder->next;
  if (pIVar7 != syminorder) {
    do {
      pSVar6 = (pIVar7->element).sym;
      if ((pSVar6->type & 0xfffeU) == 0x13e) {
        uVar16 = pSVar6->subtype;
        if (((uVar16 & 2) == 0) || (ppLVar12 = &rangeparm, (pSVar6->nrntype & 8) == 0)) {
          if ((uVar16 & 0x10) != 0) {
            *(byte *)&pSVar6->nrntype = (byte)pSVar6->nrntype | 8;
            ppLVar12 = &rangestate;
            goto LAB_0010620d;
          }
          if (((uVar16 & 8) != 0) && (ppLVar12 = &rangedep, (pSVar6->nrntype & 8) != 0))
          goto LAB_0010620d;
        }
        else {
LAB_0010620d:
          lappendsym(*ppLVar12,pSVar6);
        }
        if (((pSVar6 != indepsym) && (pSVar6->nrntype == 0)) && ((pSVar6->subtype & 2) != 0)) {
          pSVar6->nrntype = (ushort)((pSVar6->usage & 1) == 0) * 0x40 + 0x140;
        }
      }
      pIVar7 = pIVar7->next;
    } while (pIVar7 != syminorder);
  }
  pLVar10 = rangeparm;
  pIVar7 = rangeparm->next;
  pIVar9 = rangestate;
  while (pIVar8 = pIVar7, rangestate = pIVar9, pIVar8 != pLVar10) {
    pIVar7 = pIVar8->next;
    if (((ulong)((pIVar8->element).itm)->next & 0x30) != 0) {
      delete(pIVar8);
      pIVar9 = rangestate;
    }
  }
  pIVar7 = pIVar9->next;
  pIVar8 = rangedep;
  while (item = pIVar7, rangedep = pIVar8, item != pIVar9) {
    pIVar7 = item->next;
    if (((ulong)((item->element).itm)->next & 0x30) != 0) {
      delete(item);
      pIVar8 = rangedep;
    }
  }
  pIVar7 = pIVar8->next;
  pLVar10 = syminorder;
  while (pIVar9 = pIVar7, syminorder = pLVar10, pIVar9 != pIVar8) {
    pIVar7 = pIVar9->next;
    if (((ulong)((pIVar9->element).itm)->next & 0x30) != 0) {
      delete(pIVar9);
      pLVar10 = syminorder;
    }
  }
  parraycount = 0;
  varcount = 0;
  for (pLVar13 = pLVar10->next; pLVar13 != pLVar10; pLVar13 = pLVar13->next) {
    ((pLVar13->element).sym)->used = -1;
  }
  pLVar10 = rangeparm->next;
  if (pLVar10 != rangeparm) {
    do {
      var_count((pLVar10->element).sym);
      pLVar10 = pLVar10->next;
    } while (pLVar10 != rangeparm);
  }
  pLVar10 = rangedep->next;
  if (pLVar10 != rangedep) {
    do {
      var_count((pLVar10->element).sym);
      pLVar10 = pLVar10->next;
    } while (pLVar10 != rangedep);
  }
  pLVar10 = rangestate->next;
  if (pLVar10 != rangestate) {
    do {
      var_count((pLVar10->element).sym);
      pLVar10 = pLVar10->next;
    } while (pLVar10 != rangestate);
  }
  pLVar10 = syminorder->next;
  if (pLVar10 != syminorder) {
    do {
      pSVar6 = (pLVar10->element).sym;
      if (((pSVar6->nrntype & 0x100) == 0) && (pSVar6->used < 0)) {
        var_count(pSVar6);
      }
      pLVar10 = pLVar10->next;
    } while (pLVar10 != syminorder);
  }
  if (vectorize == 0) {
    iVar23 = 0;
  }
  else {
    pSVar6 = lookup("_v_unused");
    if (pSVar6 == (Symbol *)0x0) {
      pSVar6 = install("_v_unused",0x13e);
      parminstall(pSVar6,"0","","");
    }
    var_count(pSVar6);
    iVar23 = 1;
  }
  if (brkpnt_exists != 0) {
    if (vectorize == 0) {
      pcVar11 = "_g";
      pSVar6 = lookup("_g");
    }
    else {
      pcVar11 = "_g_unused";
      pSVar6 = lookup("_g_unused");
      iVar23 = 2;
    }
    if (pSVar6 == (Symbol *)0x0) {
      pSVar6 = install(pcVar11,0x13e);
      parminstall(pSVar6,"0","","");
    }
    var_count(pSVar6);
  }
  if ((debugging_ != 0) && (net_receive_ != 0)) {
    pSVar6 = lookup("_tsav");
    if (pSVar6 == (Symbol *)0x0) {
      pSVar6 = install("_tsav",0x13e);
      parminstall(pSVar6,"0","","");
    }
    var_count(pSVar6);
  }
  if (iVar23 != 0) {
    pcVar11 = "/**/";
    if (iVar23 == 2) {
      pcVar11 = "_g_unused = _g;";
    }
    sprintf(buf,
            "\n#ifndef NRN_PRCELLSTATE\n#define NRN_PRCELLSTATE 0\n#endif\n#if NRN_PRCELLSTATE\n#define _PRCELLSTATE_V _v_unused = _v;\n#define _PRCELLSTATE_G %s\n#else\n#define _PRCELLSTATE_V /**/\n#define _PRCELLSTATE_G /**/\n#endif\n"
            ,pcVar11);
    lappendstr(defs_list,buf);
  }
  if (point_process == 0) {
    iVar23 = 0;
  }
  else {
    pIVar7 = lappendstr(defs_list,"#define _nd_area  _nt_data[_ppvar[0*_STRIDE]]\n");
    pIVar7->itemtype = 0x102;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar7 = lappendstr(ppvar_semantics_,"area");
    pIVar7->itemtype = 0;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar7 = lappendstr(ppvar_semantics_,"pntproc");
    pIVar7->itemtype = 1;
    iVar23 = 2;
  }
  pIVar7 = useion->next;
  if (pIVar7 != useion) {
    do {
      if (uip == (List *)0x0) {
        uip = newlist();
        lappendstr(uip,"static void _update_ion_pointer(Datum* _ppvar) {\n");
      }
      pSVar6 = (pIVar7->element).sym;
      sprintf((char *)&d1,"%s_ion",pSVar6->name);
      pIVar7 = pIVar7->next;
      pIVar9 = ((pIVar7->element).itm)->next;
      if (pIVar9 != (pIVar7->element).itm) {
        do {
          psVar1 = &((pIVar9->element).sym)->nrntype;
          *psVar1 = *psVar1 | 0x200;
          sprintf(buf,"#define _ion_%s\t\t_nt_data[_ppvar[%d*_STRIDE]]\n",
                  ((pIVar9->element).sym)->name,iVar23);
          pIVar8 = lappendstr(defs_list,buf);
          pIVar8->itemtype = 0x102;
          pcVar11 = pSVar6->name;
          iontype(((pIVar9->element).sym)->name,pcVar11);
          sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, %d);\n",pcVar11);
          ((pIVar9->element).sym)->ioncount_ = iVar23;
          if (ppvar_semantics_ == (List *)0x0) {
            ppvar_semantics_ = newlist();
          }
          pIVar8 = lappendstr(ppvar_semantics_,(char *)&d1);
          pIVar8->itemtype = (short)iVar23;
          iVar23 = iVar23 + 1;
          pIVar9 = pIVar9->next;
        } while (pIVar9 != (pIVar7->element).itm);
      }
      pIVar7 = pIVar7->next;
      pIVar9 = ((pIVar7->element).itm)->next;
      if (pIVar9 == (pIVar7->element).itm) {
        bVar24 = true;
        bVar25 = true;
      }
      else {
        bVar25 = false;
        bVar24 = false;
        do {
          pSVar2 = (pIVar9->element).sym;
          uVar15._0_2_ = pSVar2->nrntype;
          uVar15._2_2_ = pSVar2->assigned_to_;
          if ((uVar15 >> 9 & 1) == 0) {
            sprintf(buf,"#define _ion_%s\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar2->name,iVar23);
            pIVar8 = lappendstr(defs_list,buf);
            pIVar8->itemtype = 0x102;
            pcVar11 = pSVar6->name;
            iontype(((pIVar9->element).sym)->name,pcVar11);
            sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, %d);\n",pcVar11);
            ((pIVar9->element).sym)->ioncount_ = iVar23;
            if (ppvar_semantics_ == (List *)0x0) {
              ppvar_semantics_ = newlist();
            }
            pIVar8 = lappendstr(ppvar_semantics_,(char *)&d1);
            pIVar8->itemtype = (short)iVar23;
            iVar23 = iVar23 + 1;
          }
          else {
            pSVar2->nrntype = (undefined2)uVar15 & 0xfdff;
          }
          iVar5 = iontype(((pIVar9->element).sym)->name,pSVar6->name);
          if (iVar5 == 3) {
            sprintf(buf,"#define _ion_di%sdv\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar6->name,iVar23);
            pIVar8 = lappendstr(defs_list,buf);
            pIVar8->itemtype = 0x102;
            sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, 4);\n",pSVar6->name);
            if (ppvar_semantics_ == (List *)0x0) {
              ppvar_semantics_ = newlist();
            }
            pIVar8 = lappendstr(ppvar_semantics_,(char *)&d1);
            pIVar8->itemtype = (short)iVar23;
            iVar23 = iVar23 + 1;
            bVar25 = true;
          }
          if (iVar5 - 1U < 2) {
            bVar24 = true;
          }
          pIVar9 = pIVar9->next;
        } while (pIVar9 != (pIVar7->element).itm);
        bVar24 = !bVar24;
        bVar25 = !bVar25;
      }
      if (!bVar24) {
        sprintf(buf,"#define _style_%s\t_ppvar[%d]\n",pSVar6->name);
        pIVar9 = lappendstr(defs_list,buf);
        pIVar9->itemtype = 0x102;
        sprintf(buf,"#%s",&d1);
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        pIVar9 = lappendstr(ppvar_semantics_,buf);
        pIVar9->itemtype = (short)iVar23;
        iVar23 = iVar23 + 1;
      }
      pIVar7 = pIVar7->next;
      if ((bool)(bVar25 & ldifuslist != (List *)0x0)) {
        sprintf(buf,"#define _ion_di%sdv\t_nt_data[_ppvar[%d*_STRIDE]]\n",pSVar6->name,iVar23);
        pIVar9 = lappendstr(defs_list,buf);
        pIVar9->itemtype = 0x102;
        sprintf(buf,"  nrn_update_ion_pointer(_%s_sym, _ppvar, %d, 4);\n",pSVar6->name);
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        pIVar9 = lappendstr(ppvar_semantics_,(char *)&d1);
        pIVar9->itemtype = (short)iVar23;
        iVar23 = iVar23 + 1;
      }
      pIVar7 = pIVar7->next;
    } while (pIVar7 != useion);
  }
  pLVar10 = nrnpointers->next;
  if (pLVar10 == nrnpointers) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    iVar20 = iVar23;
    do {
      pSVar6 = (pLVar10->element).sym;
      if ((pSVar6->nrntype & 0x800) != 0) {
        sprintf(buf,"#define %s\t_nt->_data[_ppvar[%d*_STRIDE]]\n",pSVar6->name);
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        pIVar7 = lappendstr(ppvar_semantics_,"pointer");
        pIVar7->itemtype = (short)iVar20;
      }
      if ((pSVar6->nrntype & 0x2000) != 0) {
        sprintf(buf,"#define _p_%s\t_nt->_vdata[_ppvar[%d*_STRIDE]]\n",pSVar6->name);
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        pIVar7 = lappendstr(ppvar_semantics_,"bbcorepointer");
        pIVar7->itemtype = (short)iVar20;
      }
      pSVar6->used = iVar20;
      pIVar7 = lappendstr(defs_list,buf);
      pIVar7->itemtype = 0x102;
      iVar5 = iVar5 + 1;
      pLVar10 = pLVar10->next;
      iVar20 = iVar20 + 1;
    } while (pLVar10 != nrnpointers);
  }
  if (diamdec == 1) {
    sprintf(buf,"#define diam\t_nt->_data[_ppvar[%d*_STRIDE]]\n",(ulong)(uint)(iVar23 + iVar5));
    pIVar7 = lappendstr(defs_list,buf);
    pIVar7->itemtype = 0x102;
  }
  if (areadec == 1) {
    sprintf(buf,"#define area\t_nt->_data[_ppvar[%d*_STRIDE]]\n",
            (ulong)((uint)diamdec + iVar5 + iVar23));
    pIVar7 = lappendstr(defs_list,buf);
    pIVar7->itemtype = 0x102;
  }
  if (uip != (List *)0x0) {
    lappendstr(uip,"}\n");
  }
  lappendstr(defs_list,
             "\n#if MAC\n#if !defined(v)\n#define v _mlhv\n#endif\n#if !defined(h)\n#define h _mlhh\n#endif\n#endif\n"
            );
  lappendstr(defs_list,"static int hoc_nrnpointerindex = ");
  if (iVar5 == 0) {
    buf._4_4_ = SUB84(buf._0_8_,4) & 0xffffff00;
    builtin_strncpy(buf,"-1;\n",4);
  }
  else {
    sprintf(buf,"%d;\n",(ulong)(uint)((nrnpointers->next->element).sym)->used);
  }
  lappendstr(defs_list,buf);
  if (vectorize != 0) {
    lappendstr(defs_list,"static ThreadDatum* _extcall_thread;\n");
  }
  lappendstr(defs_list,"/* external NEURON variables */\n");
  lVar18 = 0x41;
  bVar25 = false;
  bVar24 = false;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        pSVar6 = (pLVar10->element).sym;
        pcVar11 = pSVar6->name;
        iVar20 = strcmp(pcVar11,"nrn_ghk");
        if ((iVar20 == 0) && ((pSVar6->subtype & 0x8000) != 0)) {
          bVar24 = true;
          bVar25 = true;
        }
        if ((pSVar6->nrntype & 1) != 0) {
          iVar20 = strcmp(pcVar11,"celsius");
          if (iVar20 == 0) {
            bVar24 = true;
          }
          else {
            iVar20 = strcmp(pcVar11,"dt");
            if ((iVar20 != 0) && (iVar20 = strcmp(pcVar11,"t"), iVar20 != 0)) {
              __format = "extern double* %s;\n";
              if ((pSVar6->subtype & 0x20) == 0) {
                __format = "extern double %s;\n";
              }
              sprintf(buf,__format,pcVar11);
              lappendstr(defs_list,buf);
              pcVar11 = pSVar6->name;
              iVar20 = strcmp(pcVar11,"secondorder");
              if ((iVar20 != 0) || (iVar20 = strcmp(pcVar11,"pi"), iVar20 != 0)) {
                add_global_var("double",pcVar11,0,0,0,0);
              }
            }
          }
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  if (bVar24) {
    lappendstr(defs_list,"extern double celsius;\n");
    add_global_var("double","celsius",0,0,0,0);
  }
  if (bVar25) {
    lappendstr(defs_list,"#define nrn_ghk(v, ci, co, z) nrn_ghk(v, ci, co, z, celsius)\n");
  }
  lappendstr(defs_list,"#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* declaration of user functions */\n");
  lVar18 = 0x41;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        if (((((pLVar10->element).sym)->subtype & 0xc0) != 0) &&
           (*((pLVar10->element).sym)->name != '_')) {
          pcVar11 = "static double _hoc_%s();\n";
          if (point_process == 0) {
            pcVar11 = "static void _hoc_%s(void);\n";
          }
          sprintf(buf,pcVar11);
          lappendstr(defs_list,buf);
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  lappendstr(defs_list,"static int _mechtype;\n");
  if (point_process != 0) {
    lappendstr(defs_list,"static int _pointtype;\n");
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
    lappendstr(defs_list,
               "static void* _hoc_create_pnt(_ho) Object* _ho; { void* create_point_process();\n");
    lappendstr(defs_list,"return create_point_process(_pointtype, _ho);\n}\n");
    lappendstr(defs_list,"static void _hoc_destroy_pnt();\n");
    lappendstr(defs_list,
               "static double _hoc_loc_pnt(_vptr) void* _vptr; {double loc_point_process();\n");
    lappendstr(defs_list,"return loc_point_process(_pointtype, _vptr);\n}\n");
    lappendstr(defs_list,"static double _hoc_has_loc(_vptr) void* _vptr; {double has_loc_point();\n"
              );
    lappendstr(defs_list,"return has_loc_point(_vptr);\n}\n");
    lappendstr(defs_list,"static double _hoc_get_loc_pnt(_vptr)void* _vptr; {\n");
    lappendstr(defs_list,
               "double get_loc_point_process(); return (get_loc_point_process(_vptr));\n}\n");
    lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  }
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* connect user functions to hoc names */\n");
  lappendstr(defs_list,"static VoidFunc hoc_intfunc[] = {\n");
  if (point_process == 0) {
    sprintf(buf,"\"setdata_%s\", _hoc_setdata,\n",mechname);
  }
  else {
    lappendstr(defs_list,"0,0\n};\n");
    lappendstr(defs_list,"static Member_func _member_func[] = {\n");
    builtin_strncpy(buf,"\"loc\", _hoc_loc_pnt,\n",0x16);
    lappendstr(defs_list,buf);
    builtin_strncpy(buf,"\"has_loc\", _hoc_has_loc,\n",0x1a);
    lappendstr(defs_list,buf);
    builtin_strncpy(buf,"\"get_loc\", _hoc_get_loc_pnt,\n",0x1e);
  }
  lappendstr(defs_list,buf);
  lVar18 = 0x41;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        if (((((pLVar10->element).sym)->subtype & 0xc0) != 0) &&
           (pcVar11 = ((pLVar10->element).sym)->name, *pcVar11 != '_')) {
          sprintf(buf,"\"%s%s\", _hoc_%s,\n",pcVar11,rsuffix);
          lappendstr(defs_list,buf);
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  lappendstr(defs_list,"0, 0\n};\n");
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  if (suffix[0] != '\0') {
    lVar18 = 0x41;
    do {
      pLVar10 = symlist[lVar18]->next;
      if (pLVar10 != symlist[lVar18]) {
        do {
          if ((((pLVar10->element).sym)->subtype & 0x40) != 0) {
            sprintf(buf,"#define %s %s%s\n",((pLVar10->element).sym)->name);
            pIVar7 = lappendstr(defs_list,buf);
            pIVar7->itemtype = 0x102;
          }
          pLVar10 = pLVar10->next;
        } while (pLVar10 != symlist[lVar18]);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x7b);
  }
  lVar18 = 0x41;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        pSVar6 = (pLVar10->element).sym;
        if ((pSVar6->subtype & 0x40) != 0) {
          if (artificial_cell == 0) {
            lappendstr(defs_list,"#pragma acc routine seq\n");
          }
          sprintf(buf,"inline double %s(",pSVar6->name);
          lappendstr(defs_list,buf);
          if ((vectorize != 0) && (pSVar6->no_threadargs == 0)) {
            pcVar11 = "_threadargsprotocomma_";
            if (pSVar6->varnum == 0) {
              pcVar11 = "_threadargsproto_";
            }
            lappendstr(defs_list,pcVar11);
          }
          if (0 < pSVar6->varnum) {
            iVar20 = 0;
            do {
              lappendstr(defs_list,"double");
              iVar20 = iVar20 + 1;
              if (iVar20 < pSVar6->varnum) {
                lappendstr(defs_list,",");
              }
            } while (iVar20 < pSVar6->varnum);
          }
          lappendstr(defs_list,");\n");
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  if (vectorize == 0) {
    bVar24 = true;
  }
  else {
    iVar20 = check_tables_threads(defs_list);
    bVar24 = iVar20 == 0;
  }
  if (toplocal_ != (List *)0x0 && vectorize != 0) {
    uVar16 = 0;
    for (pLVar10 = toplocal_->next; pLVar10 != toplocal_; pLVar10 = pLVar10->next) {
      pSVar6 = (pLVar10->element).sym;
      if (pSVar6->assigned_to_ != 2) {
        if ((pSVar6->subtype & 0x20) == 0) {
          uVar16 = (ulong)((int)uVar16 + 1);
        }
        else {
          uVar16 = (ulong)(uint)((int)uVar16 + pSVar6->araydim);
        }
      }
    }
    sprintf(buf,"  _thread[%d]._pval = (double*)ecalloc(%d, sizeof(double));\n",
            (ulong)(uint)thread_data_index,uVar16);
    lappendstr(thread_mem_init_list,buf);
    sprintf(buf,"  free((void*)(_thread[%d]._pval));\n",(ulong)(uint)thread_data_index);
    lappendstr(thread_cleanup_list,buf);
    pIVar7 = toplocal_->next;
    if (pIVar7 != toplocal_) {
      do {
        pSVar6 = (pIVar7->element).sym;
        pcVar11 = pSVar6->name;
        if (pSVar6->assigned_to_ == 2) {
          if ((pSVar6->subtype & 0x20U) == 0) {
            sprintf(buf,"static double %s;\n",pcVar11);
          }
          else {
            sprintf(buf,"static double %s[%d];\n",pcVar11,(ulong)(uint)pSVar6->araydim);
          }
        }
        else if ((pSVar6->subtype & 0x20U) == 0) {
          sprintf(buf,"#define %s _thread[%d]._pval[%d]\n",pcVar11,(ulong)(uint)thread_data_index);
        }
        else {
          sprintf(buf,"#define %s (_thread[%d]._pval + %d)\n",pcVar11,(ulong)(uint)thread_data_index
                 );
        }
        lappendstr(defs_list,buf);
        pIVar7 = pIVar7->next;
      } while (pIVar7 != toplocal_);
    }
    thread_data_index = thread_data_index + 1;
  }
  if (vectorize == 0) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    lVar18 = 0x41;
    do {
      for (pLVar10 = symlist[lVar18]->next; pLVar10 != symlist[lVar18]; pLVar10 = pLVar10->next) {
        pSVar6 = (pLVar10->element).sym;
        if (((pSVar6->nrntype & 0x40) != 0) && (pSVar6->assigned_to_ == 1)) {
          if ((pSVar6->subtype & 0x20) == 0) {
            uVar15 = uVar15 + 1;
          }
          else {
            uVar15 = uVar15 + pSVar6->araydim;
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x7b);
  }
  lappendstr(defs_list,"/* declare global and static user variables */\n");
  if (uVar15 != 0) {
    sprintf(buf,
            "static int _thread1data_inuse = 0;\nstatic double _thread1data[%d];\n#define _gth %d\n"
            ,(ulong)uVar15,(ulong)(uint)thread_data_index);
    lappendstr(defs_list,buf);
    sprintf(buf,
            " if (_thread1data_inuse) {_thread[_gth]._pval = (double*)ecalloc(%d, sizeof(double));\n }else{\n _thread[_gth]._pval = _thread1data; _thread1data_inuse = 1;\n }\n"
            ,(ulong)uVar15);
    lappendstr(thread_mem_init_list,buf);
    lappendstr(thread_cleanup_list,
               " if (_thread[_gth]._pval == _thread1data) {\n   _thread1data_inuse = 0;\n  }else{\n   free((void*)_thread[_gth]._pval);\n  }\n"
              );
    thread_data_index = thread_data_index + 1;
  }
  globals_update_list = newlist();
  lVar18 = 0x41;
  local_c0 = 0;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        pSVar6 = (pLVar10->element).sym;
        if ((pSVar6->nrntype & 0x40) != 0) {
          if ((vectorize == 0) || (pSVar6->assigned_to_ != 1)) {
            decode_ustr(pSVar6,&d1,&d2,buf);
            bVar25 = (pSVar6->subtype & 0x20) != 0;
            if (bVar25) {
              sprintf(buf,"static double %s%s[%d];\n",pSVar6->name,suffix,
                      (ulong)(uint)pSVar6->araydim);
              pcVar11 = pSVar6->name;
              iVar20 = pSVar6->araydim;
            }
            else {
              sprintf(buf,"static double %s%s = %g;\n",SUB84(d1,0),pSVar6->name);
              pcVar11 = pSVar6->name;
              iVar20 = 0;
            }
            add_global_var("double",pcVar11,1,(uint)bVar25,iVar20,0);
            lappendstr(defs_list,buf);
          }
          else {
            pcVar11 = "#define %s%s (_thread1data + %d)\n#define %s (_thread[_gth]._pval + %d)\n";
            if ((pSVar6->subtype & 0x20) == 0) {
              pcVar11 = "#define %s%s _thread1data[%d]\n#define %s _thread[_gth]._pval[%d]\n";
            }
            sprintf(buf,pcVar11,pSVar6->name,suffix,local_c0,pSVar6->name,local_c0);
            pIVar7 = lappendstr(defs_list,buf);
            pIVar7->itemtype = 0x102;
            if ((pSVar6->subtype & 0x20) == 0) {
              uVar15 = (int)local_c0 + 1;
            }
            else {
              uVar15 = (int)local_c0 + pSVar6->araydim;
            }
            local_c0 = (ulong)uVar15;
          }
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"/* some parameters have upper and lower limits */\n");
  lappendstr(defs_list,"static HocParmLimits _hoc_parm_limits[] = {\n");
  lVar18 = 0x41;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        pSVar6 = (pLVar10->element).sym;
        if ((pSVar6->subtype & 2) != 0) {
          d1_1 = 0.0;
          d2_1 = 0.0;
          pcVar11 = (pSVar6->u).str;
          if (pcVar11 == (char *)0x0) {
            __assert_fail("sym->u.str",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                          ,0x6e3,"int decode_limits()");
          }
          iVar20 = 0;
LAB_0010779c:
          if (*pcVar11 != '\n') {
            if (*pcVar11 == '\0') goto LAB_001077b9;
LAB_001077b1:
            pcVar11 = pcVar11 + 1;
            goto LAB_0010779c;
          }
          iVar20 = iVar20 + 1;
          if (iVar20 != 3) goto LAB_001077b1;
          pcVar11 = pcVar11 + 1;
LAB_001077b9:
          iVar20 = __isoc99_sscanf(pcVar11,"%lf %lf\n",&d1_1,&d2_1);
          if (iVar20 == 2) {
            if (((pSVar6->nrntype & 0x40) == 0) && (point_process != 0)) {
              sprintf(buf,"\"%s\", %g, %g,\n",SUB84(d1_1,0),d2_1,pSVar6->name);
            }
            else {
              sprintf(buf,"\"%s%s\", %g, %g,\n",SUB84(d1_1,0),d2_1,pSVar6->name,suffix);
            }
            lappendstr(defs_list,buf);
          }
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  lappendstr(defs_list,"0,0,0\n};\n");
  units_reg();
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  lVar18 = 0x41;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        pSVar6 = (pLVar10->element).sym;
        if ((pSVar6->nrntype & 0x80) != 0) {
          decode_ustr(pSVar6,&d1,&d2,buf);
          bVar25 = (pSVar6->subtype & 0x20) != 0;
          if (bVar25) {
            sprintf(buf,"static double %s[%d];\n",pSVar6->name,(ulong)(uint)pSVar6->araydim);
            pcVar11 = pSVar6->name;
            iVar20 = pSVar6->araydim;
          }
          else {
            sprintf(buf,"static double %s = %g;\n",SUB84(d1,0),pSVar6->name);
            pcVar11 = pSVar6->name;
            iVar20 = 0;
          }
          add_global_var("double",pcVar11,0,(uint)bVar25,iVar20,0);
          lappendstr(defs_list,buf);
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  lappendstr(defs_list,"/* connect global user variables to hoc */\n");
  lappendstr(defs_list,"static DoubScal hoc_scdoub[] = {\n");
  pIVar7 = syminorder->next;
  if (pIVar7 != syminorder) {
    do {
      pSVar6 = (pIVar7->element).sym;
      if (((pSVar6->nrntype & 0x40) != 0) && ((pSVar6->subtype & 0x20) == 0)) {
        sprintf(buf,"\"%s%s\", &%s%s,\n",pSVar6->name,suffix,pSVar6->name,suffix);
        lappendstr(defs_list,buf);
      }
      pIVar7 = pIVar7->next;
    } while (pIVar7 != syminorder);
  }
  lappendstr(defs_list,"0,0\n};\n");
  lappendstr(defs_list,"static DoubVec hoc_vdoub[] = {\n");
  pIVar7 = syminorder->next;
  if (pIVar7 != syminorder) {
    do {
      pSVar6 = (pIVar7->element).sym;
      if (((pSVar6->nrntype & 0x40) != 0) && ((pSVar6->subtype & 0x20) != 0)) {
        sprintf(buf,"\"%s%s\", %s%s, %d,\n",pSVar6->name,suffix,pSVar6->name,suffix,
                (ulong)(uint)pSVar6->araydim);
        lappendstr(defs_list,buf);
      }
      pIVar7 = pIVar7->next;
    } while (pIVar7 != syminorder);
  }
  lappendstr(defs_list,"0,0,0\n};\n");
  lappendstr(defs_list,"static double _sav_indep;\n");
  if (0 < ba_index_) {
    lappendstr(defs_list,"static void _ba1(NrnThread*, Memb_list*, int)");
    if (1 < ba_index_) {
      uVar15 = 1;
      do {
        uVar15 = uVar15 + 1;
        sprintf(buf,", _ba%d(NrnThread*, Memb_list*, int)",(ulong)uVar15);
        lappendstr(defs_list,buf);
      } while ((int)uVar15 < ba_index_);
    }
    lappendstr(defs_list,";\n");
  }
  lappendstr(defs_list,"static void _create_global_variables(NrnThread*, Memb_list*, int);\n");
  lappendstr(defs_list,"static void _destroy_global_variables(NrnThread*, Memb_list*, int);\n");
  lappendstr(defs_list,
             "static void nrn_alloc(double*, Datum*, int);\nvoid nrn_init(NrnThread*, Memb_list*, int);\nvoid nrn_state(NrnThread*, Memb_list*, int);\n"
            );
  if ((brkpnt_exists != 0) &&
     (lappendstr(defs_list,"void nrn_cur(NrnThread*, Memb_list*, int);\n"), vectorize == 0)) {
    lappendstr(defs_list,"void nrn_jacob(NrnThread*, Memb_list*, int);\n");
  }
  if (watch_seen_ != 0) {
    lappendstr(defs_list,"void _nrn_watch_check(NrnThread*, Memb_list*);\n");
  }
  iVar20 = (uint)diamdec + iVar5 + iVar23 + (uint)areadec;
  ppvar_cnt = iVar20;
  if (net_send_seen_ != 0) {
    tqitem_index = iVar20;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar7 = lappendstr(ppvar_semantics_,"netsend");
    pIVar7->itemtype = (short)iVar20;
    ppvar_cnt = ppvar_cnt + 1;
  }
  if (watch_seen_ != 0) {
    watch_index = ppvar_cnt;
    if (0 < watch_seen_) {
      iVar20 = 0;
      do {
        iVar4 = ppvar_cnt;
        if (ppvar_semantics_ == (List *)0x0) {
          ppvar_semantics_ = newlist();
        }
        pIVar7 = lappendstr(ppvar_semantics_,"watch");
        pIVar7->itemtype = (short)iVar4 + (short)iVar20;
        iVar20 = iVar20 + 1;
      } while (iVar20 < watch_seen_);
    }
    ppvar_cnt = ppvar_cnt + watch_seen_;
    sprintf(buf,"\n#define _watch_array(arg) _ppvar[(arg + %d)*_STRIDE]",(ulong)(uint)watch_index);
    lappendstr(defs_list,buf);
    lappendstr(defs_list,"\n");
    sprintf(buf,
            "\n#define _nrn_watch_activate(_item)\\\n  if (_watch_rm == 0) {\\\n    int _i;\\\n    for (_i = 1; _i < %d; ++_i) {\\\n      _watch_array(_i) = 0;\\\n    }\\\n    _watch_rm = 1;\\\n  }\\\n  _watch_array(_item) = 2 +"
            ,(ulong)(uint)watch_seen_);
    lappendstr(defs_list,buf);
  }
  if (for_netcons_ != 0) {
    sprintf(buf,"\n#define _fnc_index %d\n",(ulong)(uint)ppvar_cnt);
    lappendstr(defs_list,buf);
    iVar20 = ppvar_cnt;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar7 = lappendstr(ppvar_semantics_,"fornetcon");
    pIVar7->itemtype = (short)iVar20;
    ppvar_cnt = ppvar_cnt + 1;
  }
  if (point_process != 0) {
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
    lappendstr(defs_list,"static void _hoc_destroy_pnt(_vptr) void* _vptr; {\n");
    if (for_netcons_ != 0 || watch_seen_ != 0) {
      lappendstr(defs_list,"  Prop* _prop = ((Point_process*)_vptr)->_prop;\n");
    }
    if (for_netcons_ != 0) {
      memcpy(buf,"  if (_prop) { _nrn_free_fornetcon(&(_prop->dparam[_fnc_index]._pvoid));}\n",0x4b)
      ;
      lappendstr(defs_list,buf);
    }
    lappendstr(defs_list,"  destroy_point_process(_vptr);\n}\n");
    lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  }
  iVar20 = ppvar_cnt;
  if (cvode_emit != 0) {
    cvode_ieq_index = ppvar_cnt;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar7 = lappendstr(ppvar_semantics_,"cvodeieq");
    pIVar7->itemtype = (short)iVar20;
    ppvar_cnt = ppvar_cnt + 1;
  }
  cvode_emit_interface();
  if (destructorfunc->next != destructorfunc) {
    if (point_process == 0) {
      diag("DESTRUCTOR only permitted for POINT_PROCESS",(char *)0x0);
    }
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\nstatic void _destructor(Prop*);\n#endif\n");
  }
  if (constructorfunc->next != constructorfunc) {
    lappendstr(defs_list,"\n#if 0 /*BBCORE*/\nstatic void _constructor(Prop*);\n#endif\n");
  }
  lappendstr(defs_list,"/* connect range variables in _p that hoc is supposed to know about */\n");
  lappendstr(defs_list,"static const char *_mechanism[] = {\n");
  sprintf(buf,"\"%s\",\n\"%s\",\n",nmodl_version_,mechname);
  lappendstr(defs_list,buf);
  pIVar7 = rangeparm->next;
  if (pIVar7 != rangeparm) {
    do {
      pSVar6 = (pIVar7->element).sym;
      if ((pSVar6->subtype & 0x20) == 0) {
        sprintf(buf,"\"%s%s\",\n",pSVar6->name,rsuffix);
      }
      else {
        sprintf(buf,"\"%s%s[%d]\",\n",pSVar6->name,rsuffix,(ulong)(uint)pSVar6->araydim);
      }
      lappendstr(defs_list,buf);
      pIVar7 = pIVar7->next;
    } while (pIVar7 != rangeparm);
  }
  lappendstr(defs_list,"0,\n");
  pIVar7 = rangedep->next;
  if (pIVar7 != rangedep) {
    do {
      pSVar6 = (pIVar7->element).sym;
      if ((pSVar6->subtype & 0x20) == 0) {
        sprintf(buf,"\"%s%s\",\n",pSVar6->name,rsuffix);
      }
      else {
        sprintf(buf,"\"%s%s[%d]\",\n",pSVar6->name,rsuffix,(ulong)(uint)pSVar6->araydim);
      }
      lappendstr(defs_list,buf);
      pIVar7 = pIVar7->next;
    } while (pIVar7 != rangedep);
  }
  lappendstr(defs_list,"0,\n");
  pIVar7 = rangestate->next;
  if (pIVar7 != rangestate) {
    do {
      pSVar6 = (pIVar7->element).sym;
      if ((pSVar6->subtype & 0x20) == 0) {
        sprintf(buf,"\"%s%s\",\n",pSVar6->name,rsuffix);
      }
      else {
        sprintf(buf,"\"%s%s[%d]\",\n",pSVar6->name,rsuffix,(ulong)(uint)pSVar6->araydim);
      }
      lappendstr(defs_list,buf);
      pIVar7 = pIVar7->next;
    } while (pIVar7 != rangestate);
  }
  lappendstr(defs_list,"0,\n");
  pIVar7 = nrnpointers->next;
  if (pIVar7 != nrnpointers) {
    do {
      pSVar6 = (pIVar7->element).sym;
      if ((pSVar6->subtype & 0x20) == 0) {
        sprintf(buf,"\"%s%s\",\n",pSVar6->name,rsuffix);
      }
      else {
        sprintf(buf,"\"%s%s[%d]\",\n",pSVar6->name,rsuffix,(ulong)(uint)pSVar6->araydim);
      }
      lappendstr(defs_list,buf);
      pIVar7 = pIVar7->next;
    } while (pIVar7 != nrnpointers);
  }
  lappendstr(defs_list,"0};\n");
  if (diamdec == 1) {
    lappendstr(defs_list,"static Symbol* _morphology_sym;\n");
  }
  pIVar7 = useion->next;
  if (pIVar7 != useion) {
    do {
      pSVar6 = (pIVar7->element).sym;
      sprintf(buf,"static int _%s_type;\n",pSVar6->name);
      lappendstr(defs_list,buf);
      if (ldifuslist != (List *)0x0) {
        sprintf(buf,"static int _type_i%s;\n",pSVar6->name);
        lappendstr(defs_list,buf);
      }
      pIVar7 = pIVar7->next->next->next->next;
    } while (pIVar7 != useion);
  }
  lappendstr(globals_update_list,"struct _global_variables_t : public MemoryManaged {\n");
  if (0 < global_variables_count) {
    lVar19 = 0;
    lVar18 = 0;
    do {
      if (*(int *)((long)&global_variables->is_array + lVar19) == 0) {
        sprintf(buf,"  %s %s;\n",global_variables->type + lVar19);
      }
      else {
        sprintf(buf,"  %s %s[%d];\n",global_variables->type + lVar19,global_variables->name + lVar19
                ,(ulong)*(uint *)((long)&global_variables->array_length + lVar19));
      }
      lappendstr(globals_update_list,buf);
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x2020;
    } while (lVar18 < global_variables_count);
  }
  lappendstr(globals_update_list,"};\n\n");
  lappendstr(globals_update_list,
             "\nstatic void _create_global_variables(NrnThread *_nt, Memb_list *_ml, int _type) {\n"
            );
  lappendstr(globals_update_list,"  assert(!_ml->global_variables);\n");
  lappendstr(globals_update_list,"  _ml->global_variables = new _global_variables_t{};\n");
  lappendstr(globals_update_list,"  _ml->global_variables_size = sizeof(_global_variables_t);\n");
  lappendstr(globals_update_list,"}\n");
  lappendstr(globals_update_list,
             "\nstatic void _destroy_global_variables(NrnThread *_nt, Memb_list *_ml, int _type) {\n"
            );
  lappendstr(globals_update_list,
             "  delete static_cast<_global_variables_t*>(_ml->global_variables);\n");
  lappendstr(globals_update_list,"  _ml->global_variables = nullptr;\n");
  lappendstr(globals_update_list,"  _ml->global_variables_size = 0;\n");
  lappendstr(globals_update_list,"}\n");
  lappendstr(globals_update_list,
             "\nstatic void _update_global_variables(NrnThread *_nt, Memb_list *_ml) {\n");
  lappendstr(globals_update_list,"  if(!_nt || !_ml) {\n");
  lappendstr(globals_update_list,"    return;\n");
  lappendstr(globals_update_list,"  }\n");
  lappendstr(globals_update_list,
             "  auto* const _global_variables = static_cast<_global_variables_t*>(_ml->global_variables);\n"
            );
  if (0 < global_variables_count) {
    lVar18 = 0;
    do {
      if (global_variables[lVar18].skip_initialisation == 0) {
        pcVar11 = suffix;
        if (global_variables[lVar18].is_nrnglobal == 0) {
          pcVar11 = "";
        }
        if (global_variables[lVar18].is_array == 0) {
          sprintf(buf,"  _global_variables->%s = %s%s;\n",global_variables[lVar18].name,
                  global_variables[lVar18].name,pcVar11);
          lappendstr(globals_update_list,buf);
        }
        else if (0 < global_variables[lVar18].array_length) {
          uVar16 = 0;
          do {
            sprintf(buf,"  _global_variables->%s[%d] = %s%s[%d];\n",global_variables[lVar18].name,
                    uVar16,global_variables[lVar18].name,pcVar11,uVar16);
            lappendstr(globals_update_list,buf);
            uVar15 = (int)uVar16 + 1;
            uVar16 = (ulong)uVar15;
          } while ((int)uVar15 < global_variables[lVar18].array_length);
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < global_variables_count);
  }
  if (artificial_cell == 0) {
    lappendstr(globals_update_list,"#ifdef CORENEURON_ENABLE_GPU\n");
    lappendstr(globals_update_list,"  if (_nt->compute_gpu) {\n");
    lappendstr(globals_update_list,"      cnrn_target_update_on_device(_global_variables);\n");
    lappendstr(globals_update_list,"  }\n");
    lappendstr(globals_update_list,"#endif\n");
  }
  lappendstr(globals_update_list,"}\n\n");
  if (0 < global_variables_count) {
    lVar19 = 0x10;
    lVar18 = 0;
    do {
      sprintf(buf,"#define %s static_cast<_global_variables_t*>(_ml->global_variables)->%s\n",
              global_variables->type + lVar19);
      lappendstr(globals_update_list,buf);
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x2020;
    } while (lVar18 < global_variables_count);
  }
  lappendstr(globals_update_list,"\n");
  lappendstr(defs_list,"\nstatic void nrn_alloc(double* _p, Datum* _ppvar, int _type) {\n");
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  lappendstr(defs_list,"\t/*initialize range parameters*/\n");
  pLVar10 = rangeparm->next;
  if (pLVar10 != rangeparm) {
    do {
      pSVar6 = (pLVar10->element).sym;
      if ((pSVar6->subtype & 0x20) == 0) {
        decode_ustr(pSVar6,&d1,&d2,buf);
        sprintf(buf,"\t%s = %g;\n",SUB84(d1,0),pSVar6->name);
        lappendstr(defs_list,buf);
      }
      pLVar10 = pLVar10->next;
    } while (pLVar10 != rangeparm);
  }
  sVar14 = (short)(iVar5 + iVar23);
  if (diamdec == 1) {
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar7 = lappendstr(ppvar_semantics_,"diam");
    pIVar7->itemtype = sVar14;
  }
  if (areadec == 1) {
    uVar3 = (ushort)diamdec;
    if (ppvar_semantics_ == (List *)0x0) {
      ppvar_semantics_ = newlist();
    }
    pIVar7 = lappendstr(ppvar_semantics_,"area");
    pIVar7->itemtype = sVar14 + uVar3;
  }
  pLVar10 = useion->next;
  if (pLVar10 != useion) {
    uVar16 = (ulong)((uint)(point_process != 0) * 2);
    do {
      pSVar6 = (pLVar10->element).sym;
      sprintf(buf,"prop_ion = need_memb(_%s_sym);\n",pSVar6->name);
      lappendstr(defs_list,buf);
      if (ldifuslist != (List *)0x0) {
        sprintf(buf," _type_i%s = prop_ion->_type;\n",pSVar6->name);
        lappendstr(defs_list,buf);
      }
      pIVar7 = pLVar10->next;
      pcVar11 = ((pLVar10->element).sym)->name;
      pIVar9 = ((pIVar7->element).itm)->next;
      if (pIVar9 == (pIVar7->element).itm) {
        uVar15 = 0;
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        uVar15 = 0;
        do {
          iVar23 = iontype(((pIVar9->element).sym)->name,pcVar11);
          if (iVar23 == 0) {
            uVar21 = 1;
          }
          if (iVar23 - 1U < 2) {
            uVar15 = 1;
          }
          pIVar9 = pIVar9->next;
          pIVar7 = pLVar10->next;
        } while (pIVar9 != (pIVar7->element).itm);
      }
      for (pIVar7 = ((pIVar7->next->element).itm)->next;
          pIVar7 != (pLVar10->next->next->element).itm; pIVar7 = pIVar7->next) {
        iVar23 = iontype(((pIVar7->element).sym)->name,pcVar11);
        if (iVar23 == 1) {
          lappendstr(defs_list,"nrn_check_conc_write(_prop, prop_ion, 1);\n");
          uVar15 = 3;
        }
        if (iVar23 == 2) {
          lappendstr(defs_list,"nrn_check_conc_write(_prop, prop_ion, 0);\n");
          uVar15 = 3;
        }
        if (iVar23 == 0) {
          uVar21 = 3;
        }
      }
      if (uVar15 != 0 || uVar21 != 0) {
        sprintf(buf,"nrn_promote(prop_ion, %d, %d);\n",(ulong)uVar15,(ulong)uVar21);
        lappendstr(defs_list,buf);
      }
      pIVar7 = pLVar10->next;
      pIVar9 = ((pIVar7->element).itm)->next;
      if (pIVar9 != (pIVar7->element).itm) {
        do {
          psVar1 = &((pIVar9->element).sym)->nrntype;
          *psVar1 = *psVar1 | 0x200;
          uVar22 = (ulong)((int)uVar16 + 1);
          uVar15 = iontype(((pIVar9->element).sym)->name,pSVar6->name);
          sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* %s */\n",uVar16,(ulong)uVar15,
                  ((pIVar9->element).sym)->name);
          lappendstr(defs_list,buf);
          pIVar9 = pIVar9->next;
          uVar16 = uVar22;
        } while (pIVar9 != (pIVar7->element).itm);
      }
      pIVar7 = pIVar7->next;
      pIVar9 = ((pIVar7->element).itm)->next;
      if (pIVar9 == (pIVar7->element).itm) {
        bVar17 = true;
        bVar25 = true;
      }
      else {
        bVar25 = false;
        bVar17 = false;
        do {
          uVar15 = iontype(((pIVar9->element).sym)->name,pSVar6->name);
          pSVar2 = (pIVar9->element).sym;
          uVar21._0_2_ = pSVar2->nrntype;
          uVar21._2_2_ = pSVar2->assigned_to_;
          if ((uVar21 >> 9 & 1) == 0) {
            sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* %s */\n",uVar16,(ulong)uVar15
                    ,pSVar2->name);
            lappendstr(defs_list,buf);
            uVar16 = (ulong)((int)uVar16 + 1);
          }
          else {
            pSVar2->nrntype = (undefined2)uVar21 & 0xfdff;
          }
          if (uVar15 == 3) {
            sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* _ion_di%sdv */\n",uVar16,4,
                    pSVar6->name);
            lappendstr(defs_list,buf);
            bVar17 = true;
            uVar16 = (ulong)((int)uVar16 + 1);
          }
          if (uVar15 - 1 < 2) {
            bVar25 = true;
          }
          pIVar9 = pIVar9->next;
        } while (pIVar9 != (pIVar7->element).itm);
        bVar25 = !bVar25;
        bVar17 = !bVar17;
      }
      if (!bVar25) {
        sprintf(buf,
                "\t_ppvar[%d]._pvoid = (void*)(&(prop_ion->dparam[0]._i)); /* iontype for %s */\n",
                uVar16,pSVar6->name);
        lappendstr(defs_list,buf);
        uVar16 = (ulong)((int)uVar16 + 1);
      }
      pIVar7 = pIVar7->next;
      if ((bool)(bVar17 & ldifuslist != (List *)0x0)) {
        sprintf(buf,"\t_ppvar[%d]._pval = &prop_ion->param[%d]; /* _ion_di%sdv */\n",uVar16,4,
                pSVar6->name);
        lappendstr(defs_list,buf);
        uVar16 = (ulong)((int)uVar16 + 1);
      }
      pLVar10 = pIVar7->next;
    } while (pLVar10 != useion);
  }
  lappendstr(defs_list,"\n#endif /* BBCORE */\n");
  if (constructorfunc->next != constructorfunc) {
    lappendstr(defs_list,
               "\n#if 0 /*BBCORE*/\nif (!nrn_point_prop_) {_constructor(_prop);}\n#endif\n");
    pcVar11 = 
    "\n#if 0 /*BBCORE*/\nstatic _constructor(_prop)\n\tProp *_prop; double* _p; Datum* _ppvar; ThreadDatum* _thread;\n{\n\t_thread = (Datum*)0;\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
    ;
    if (vectorize == 0) {
      pcVar11 = 
      "\n#if 0 /*BBCORE*/\nstatic void _constructor(Prop* _prop) {\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
      ;
    }
    lappendstr(procfunc,pcVar11);
    movelist(constructorfunc->next,constructorfunc->prev,procfunc);
    lappendstr(procfunc,"\n}\n}\n#endif /*BBCORE*/\n");
  }
  lappendstr(defs_list,"\n}\n");
  lappendstr(defs_list,"static void _initlists(Memb_list *_ml);\n");
  if (cvode_emit != 0) {
    lappendstr(defs_list," /* some states have an absolute tolerance */\n");
    lappendstr(defs_list,"static Symbol** _atollist;\n");
    lappendstr(defs_list,"static HocStateTolerance _hoc_state_tol[] = {\n");
    pLVar10 = rangestate->next;
    if (pLVar10 != rangestate) {
      do {
        pSVar6 = (pLVar10->element).sym;
        if ((pSVar6->subtype & 0x10) != 0) {
          pcVar11 = (pSVar6->u).str;
          iVar23 = 0;
LAB_00108cd5:
          if (*pcVar11 != '\n') {
            if (*pcVar11 == '\0') goto LAB_00108cf2;
LAB_00108cea:
            pcVar11 = pcVar11 + 1;
            goto LAB_00108cd5;
          }
          iVar23 = iVar23 + 1;
          if (iVar23 != 3) goto LAB_00108cea;
          pcVar11 = pcVar11 + 1;
LAB_00108cf2:
          iVar23 = __isoc99_sscanf(pcVar11,"%lf\n",&d1_1);
          if (iVar23 == 1) {
            if (point_process == 0) {
              sprintf(buf,"\"%s%s\", %g,\n",SUB84(d1_1,0),pSVar6->name,suffix);
            }
            else {
              sprintf(buf,"\"%s\", %g,\n",SUB84(d1_1,0),pSVar6->name);
            }
            lappendstr(defs_list,buf);
          }
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != rangestate);
    }
    lappendstr(defs_list,"0,0\n};\n");
  }
  if (singlechan_ != 0) {
    sprintf(buf,"static _singlechan_declare%d();\n");
    lappendstr(defs_list,buf);
  }
  if (net_send_seen_ != 0) {
    if (net_receive_ == 0) {
      diag("can\'t use net_send if there is no NET_RECEIVE block",(char *)0x0);
    }
    sprintf(buf,"\n#define _tqitem &(_nt->_vdata[_ppvar[%d*_STRIDE]])\n",(ulong)(uint)tqitem_index);
    lappendstr(defs_list,buf);
    if (net_receive_buffering_ != 0) {
      sprintf(buf,
              "\n#if NET_RECEIVE_BUFFERING\n#undef _tqitem\n#define _tqitem _ppvar[%d*_STRIDE]\n#endif\n\n"
              ,(ulong)(uint)tqitem_index);
      lappendstr(defs_list,buf);
    }
    if (net_send_delivered_ != (Item *)0x0) {
      insertstr(net_send_delivered_,
                "\n#if !NET_RECEIVE_BUFFERING\n  if (_lflag == 1. ) {*(_tqitem) = 0;}\n#endif\n");
    }
  }
  if ((net_receive_ != 0) &&
     (lappendstr(defs_list,"void _net_receive(Point_process*, int, double);\n"),
     net_init_q1_ != (Item *)0x0)) {
    lappendstr(defs_list,"void _net_init(Point_process*, int, double);\n");
  }
  if ((vectorize != 0) && (thread_mem_init_list->next != thread_mem_init_list)) {
    lappendstr(defs_list,"static void _thread_mem_init(ThreadDatum*);\n");
  }
  if ((vectorize != 0) && (thread_cleanup_list->next != thread_cleanup_list)) {
    lappendstr(defs_list,"static void _thread_cleanup(ThreadDatum*);\n");
  }
  if (uip != (List *)0x0) {
    lappendstr(defs_list,"static void _update_ion_pointer(Datum*);\n");
  }
  sprintf(buf,"\n#define _psize %d\n#define _ppsize %d\n",(ulong)(uint)parraycount,
          (ulong)(uint)ppvar_cnt);
  lappendstr(defs_list,buf);
  sprintf(buf,"void _%s_reg() {\n\tint _vectorized = %d;\n",modbase,(ulong)(uint)vectorize);
  lappendstr(defs_list,buf);
  lappendstr(defs_list,"");
  if (suffix[0] == '\0') goto LAB_0010977b;
  lappendstr(defs_list,"_mechtype = nrn_get_mechtype(_mechanism[1]);\n");
  lappendstr(defs_list,"if (_mechtype == -1) return;\n");
  lappendstr(defs_list,"_nrn_layout_reg(_mechtype, LAYOUT);\n");
  pIVar7 = useion->next;
  if (pIVar7 != useion) {
    do {
      sprintf(buf,"_%s_type = nrn_get_mechtype(\"%s_ion\");",((pIVar7->element).sym)->name);
      lappendstr(defs_list,buf);
      pIVar7 = pIVar7->next->next->next->next;
    } while (pIVar7 != useion);
  }
  lappendstr(defs_list,"\n#if 0 /*BBCORE*/\n");
  pIVar7 = useion->next;
  if (pIVar7 != useion) {
    do {
      sprintf(buf,"\tion_reg(\"%s\", %s);\n",((pIVar7->element).sym)->name,
              (pIVar7->next->next->next->element).itm);
      lappendstr(defs_list,buf);
      pIVar7 = pIVar7->next->next->next->next;
    } while (pIVar7 != useion);
  }
  if (diamdec == 1) {
    lappendstr(defs_list,"\t_morphology_sym = hoc_lookup(\"morphology\");\n");
  }
  pIVar7 = useion->next;
  if (pIVar7 != useion) {
    do {
      sprintf(buf,"\t_%s_sym = hoc_lookup(\"%s_ion\");\n",((pIVar7->element).sym)->name);
      lappendstr(defs_list,buf);
      pIVar7 = pIVar7->next->next->next->next;
    } while (pIVar7 != useion);
  }
  lappendstr(defs_list,"\n#endif /*BBCORE*/\n");
  uVar15 = thread_data_index + 1;
  if (vectorize == 0) {
    uVar15 = 0;
  }
  if (point_process == 0) {
    sprintf(buf,
            " register_mech(_mechanism, nrn_alloc,%s, nrn_init, _create_global_variables, _destroy_global_variables, hoc_nrnpointerindex, %d);\n"
            ,brkpnt_str_,(ulong)uVar15);
    pcVar11 = buf;
LAB_001091cb:
    pIVar7 = local_a8;
    lappendstr(defs_list,pcVar11);
  }
  else {
    sprintf(buf,
            "\t_pointtype = point_register_mech(_mechanism,\n\t nrn_alloc,%s, nrn_init, _create_global_variables, _destroy_global_variables,\n\t hoc_nrnpointerindex,\n\t NULL/*_hoc_create_pnt*/, NULL/*_hoc_destroy_pnt*/, /*_member_func,*/\n\t %d);\n"
            ,brkpnt_str_,(ulong)uVar15);
    lappendstr(defs_list,buf);
    pIVar7 = local_a8;
    if (destructorfunc->next != destructorfunc) {
      pcVar11 = "    #if 0 /*BBCORE*/\n    register_destructor(_destructor);\n    #endif\n";
      goto LAB_001091cb;
    }
  }
  if (thread_data_index != 0 && vectorize != 0) {
    sprintf(buf," _extcall_thread = (ThreadDatum*)ecalloc(%d, sizeof(ThreadDatum));\n");
    lappendstr(defs_list,buf);
    if ((thread_mem_init_list->next != thread_mem_init_list) &&
       (lappendstr(defs_list," _thread_mem_init(_extcall_thread);\n"), (int)local_c0 != 0)) {
      lappendstr(defs_list," _thread1data_inuse = 0;\n");
    }
  }
  if (vectorize != 0) {
    insertstr(pIVar7,"\n#define _thread_present_ /**/");
    if (thread_data_index != 0) {
      sprintf(buf,", _thread[0:%d]");
      insertstr(pIVar7,buf);
    }
    insertstr(pIVar7,"\n");
  }
  if ((vectorize != 0) && (thread_mem_init_list->next != thread_mem_init_list)) {
    lappendstr(defs_list,"    _nrn_thread_reg1(_mechtype, _thread_mem_init);\n");
  }
  if ((vectorize != 0) && (thread_cleanup_list->next != thread_cleanup_list)) {
    lappendstr(defs_list,"    _nrn_thread_reg0(_mechtype, _thread_cleanup);\n");
  }
  if (!bVar24) {
    lappendstr(defs_list,"    _nrn_thread_table_reg(_mechtype, _check_table_thread);\n");
  }
  if (use_bbcorepointer == '\x01') {
    lappendstr(defs_list,"  hoc_reg_bbcore_read(_mechtype, bbcore_read);\n");
    lappendstr(defs_list,"  hoc_reg_bbcore_write(_mechtype, bbcore_write);\n");
  }
  builtin_strncpy(buf," hoc_register_prop_size(_mechtype, _psize, _ppsize);\n",0x36);
  lappendstr(defs_list,buf);
  if ((ppvar_semantics_ != (List *)0x0) &&
     (pIVar7 = ppvar_semantics_->next, pIVar7 != ppvar_semantics_)) {
    do {
      sprintf(buf," hoc_register_dparam_semantics(_mechtype, %d, \"%s\");\n",
              (ulong)(uint)(int)pIVar7->itemtype,(pIVar7->element).itm);
      lappendstr(defs_list,buf);
      pIVar7 = pIVar7->next;
    } while (pIVar7 != ppvar_semantics_);
  }
  pLVar10 = useion->next;
  if (pLVar10 != useion) {
    iVar23 = 0;
    do {
      pIVar7 = pLVar10->next->next;
      pIVar9 = ((pIVar7->element).itm)->next;
      if (pIVar9 != (pIVar7->element).itm) {
        do {
          iVar5 = iontype(((pIVar9->element).sym)->name,((pLVar10->element).sym)->name);
          iVar23 = iVar23 + (uint)(iVar5 - 1U < 2);
          pIVar9 = pIVar9->next;
          pIVar7 = pLVar10->next->next;
        } while (pIVar9 != (pIVar7->element).itm);
      }
      pLVar10 = pIVar7->next->next;
    } while (pLVar10 != useion);
    if (iVar23 != 0) {
      lappendstr(defs_list,"\tnrn_writes_conc(_mechtype, 0);\n");
    }
  }
  printf("cvode_emit=%d cvode_not_allowed=%d\n",(ulong)(uint)cvode_emit,
         (ulong)(uint)cvode_not_allowed);
  if (cvode_emit != 0) {
    lappendstr(defs_list,
               "\thoc_register_cvode(_mechtype, _ode_count, _ode_map, _ode_spec, _ode_matsol);\n");
    lappendstr(defs_list,"\thoc_register_tolerance(_mechtype, _hoc_state_tol, &_atollist);\n");
    if (ion_synonym != (List *)0x0) {
      lappendstr(defs_list,"\thoc_register_synonym(_mechtype, _ode_synonym);\n");
    }
  }
  if (singlechan_ != 0) {
    sprintf(buf,"hoc_reg_singlechan(_mechtype, _singlechan_declare%d);\n");
    lappendstr(defs_list,buf);
  }
  if (artificial_cell != 0) {
    if ((((brkpnt_exists != 0) || (net_receive_ == 0)) || (nrnpointers->next != nrnpointers)) ||
       (useion->next != useion)) {
      puts(
          "Notice: ARTIFICIAL_CELL is a synonym for POINT_PROCESS which hints that it\nonly affects and is affected by discrete events. As such it is not\nlocated in a section and is not associated with an integrator"
          );
    }
    sprintf(buf,"add_nrn_artcell(_mechtype, %d);\n",(ulong)(uint)tqitem_index);
    lappendstr(defs_list,buf);
  }
  if (net_event_seen_ != 0) {
    lappendstr(defs_list,"add_nrn_has_net_event(_mechtype);\n");
  }
  if (watch_seen_ != 0) {
    lappendstr(defs_list,"hoc_register_watch_check(_nrn_watch_check, _mechtype);\n");
  }
  if ((net_receive_buffering_ != 0) &&
     (lappendstr(defs_list,
                 "\n#if NET_RECEIVE_BUFFERING\n  hoc_register_net_receive_buffering(_net_buf_receive, _mechtype);\n#endif\n"
                ), net_event_seen_ != 0 || net_send_seen_ != 0)) {
    lappendstr(defs_list,
               "\n#if NET_RECEIVE_BUFFERING\n  hoc_register_net_send_buffering(_mechtype);\n#endif\n"
              );
  }
  if (net_receive_ != 0) {
    pcVar11 = "set_pnt_receive(_mechtype, _net_receive, _net_init, %d);\n";
    if (net_init_q1_ == (Item *)0x0) {
      pcVar11 = "set_pnt_receive(_mechtype, _net_receive, nullptr, %d);\n";
    }
    sprintf(buf,pcVar11);
    lappendstr(defs_list,buf);
  }
  if (for_netcons_ != 0) {
    builtin_strncpy(buf + 0x20,"nc_index);\n",0xc);
    builtin_strncpy(buf + 0x10,"ns(_mechtype, _f",0x10);
    builtin_strncpy(buf,"add_nrn_fornetco",0x10);
    lappendstr(defs_list,buf);
  }
  if (0 < ba_index_) {
    uVar15 = 0;
    pIVar7 = ba_list_;
    do {
      pIVar7 = pIVar7->next;
      pLVar10 = get_ion_variables(0);
      if (pLVar10->next != pLVar10->prev) {
        move(pLVar10->next,pLVar10->prev,(pIVar7->element).itm);
        freelist((List **)pLVar10);
      }
      pIVar7 = pIVar7->next;
      pLVar10 = set_ion_variables(0);
      if (pLVar10->next != pLVar10->prev) {
        move(pLVar10->next,pLVar10->prev,(pIVar7->element).itm);
        freelist((List **)pLVar10);
      }
      uVar15 = uVar15 + 1;
      pIVar7 = pIVar7->next;
      sprintf(buf,"\thoc_reg_ba(_mechtype, _ba%d, %s);\n",(ulong)uVar15,(pIVar7->element).itm);
      lappendstr(defs_list,buf);
    } while ((int)uVar15 < ba_index_);
  }
  if (ldifuslist != (List *)0x0) {
    lappendstr(defs_list,"\thoc_register_ldifus1(_difusfunc);\n");
    linsertstr(defs_list,"static void _difusfunc(ldifusfunc2_t, NrnThread*);\n");
  }
LAB_0010977b:
  lappendstr(defs_list,"\thoc_register_var(hoc_scdoub, hoc_vdoub, NULL);\n");
  lappendstr(defs_list,"}\n");
  if ((vectorize != 0) && (thread_mem_init_list->next != thread_mem_init_list)) {
    lappendstr(procfunc,"\nstatic void _thread_mem_init(ThreadDatum* _thread) {\n");
    move(thread_mem_init_list->next,thread_mem_init_list->prev,procfunc);
    lappendstr(procfunc,"}\n");
  }
  if ((vectorize != 0) && (thread_cleanup_list->next != thread_cleanup_list)) {
    lappendstr(procfunc,"\nstatic void _thread_cleanup(ThreadDatum* _thread) {\n");
    move(thread_cleanup_list->next,thread_cleanup_list->prev,procfunc);
    lappendstr(procfunc,"}\n");
  }
  if (uip != (List *)0x0) {
    move(uip->next,uip->prev,procfunc);
  }
  if (destructorfunc->next != destructorfunc) {
    pcVar11 = 
    "\n#if 0 /*BBCORE*/\nstatic _destructor(_prop)\n\tProp *_prop; double* _p; Datum* _ppvar; ThreadDatum* _thread;\n{\n\t_thread = (Datum*)0;\n\t_p = prop->param; _ppvar = _prop->dparam;\n{\n"
    ;
    if (vectorize == 0) {
      pcVar11 = 
      "\n#if 0 /*BBCORE*/\nstatic void _destructor(Prop* _prop) {\n\t_p = _prop->param; _ppvar = _prop->dparam;\n{\n"
      ;
    }
    lappendstr(procfunc,pcVar11);
    movelist(destructorfunc->next,destructorfunc->prev,procfunc);
    lappendstr(procfunc,"\n}\n}\n#endif /*BBCORE*/\n");
  }
  if (ldifuslist != (List *)0x0) {
    ldifusreg();
  }
  if (watch_seen_ != 0) {
    lappendstr(procfunc,
               "\nvoid _nrn_watch_check(NrnThread* _nt, Memb_list* _ml) {\n  double* _p; Datum* _ppvar; ThreadDatum* _thread;\n  int* _ni; double v; int _iml, _cntml_padded, _cntml_actual;\n  _cntml_actual = _ml->_nodecount;\n  _cntml_padded = _ml->_nodecount_padded;\n  _ni = _ml->_nodeindices;\n  _thread = _ml->_thread;\n  double * _nt_data = _nt->_data;\n  double * _vec_v = _nt->_actual_v;\n  int stream_id = _nt->stream_id;\n"
              );
    lappendstr(procfunc,
               "\n  #if LAYOUT == 1 /*AoS*/\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n    _p = _ml->_data + _iml*_psize; _ppvar = _ml->_pdata + _iml*_ppsize;\n  #elif LAYOUT == 0 /*SoA*/\n    _p = _ml->_data; _ppvar = _ml->_pdata;\n  /* insert compiler dependent ivdep like pragma */\n  _PRAGMA_FOR_VECTOR_LOOP_\n  _PRAGMA_FOR_STATE_ACC_LOOP_\n  for (_iml = 0; _iml < _cntml_actual; ++_iml) {\n  #else /* LAYOUT > 1 */ /*AoSoA*/\n  #error AoSoA not implemented.\n  for (;;) { /* help clang-format properly indent */\n  #endif\n    v = _vec_v[_ni[_iml]];\n#if NRN_PRCELLSTATE\n    _v_unused = v;\n#endif\n    bool _untriggered = true;\n"
              );
    pLVar10 = watch_data_->next;
    if (pLVar10 != watch_data_) {
      uVar16 = 1;
      do {
        pIVar7 = pLVar10->next->next;
        pSVar6 = (pIVar7->element).sym;
        pcVar11 = items_as_string((pLVar10->element).itm,(pLVar10->next->element).itm);
        lVar18 = pSVar6->subtype;
        sprintf(buf,
                "\n    if (_watch_array(%d)&2 && _untriggered) {\n      if %s {\n        if ((_watch_array(%d)&1) == 0) {\n          _untriggered = false;\n          #if NET_RECEIVE_BUFFERING\n          _net_send_buffering(_ml->_net_send_buffer, 0, _tqitem, -1, _ppvar[1*_STRIDE], t +  0.0 , %s );\n          #else\n          net_send ( _tqitem, -1, (Point_process*) _nt->_vdata[_ppvar[1*_STRIDE]], t +  0.0 , %s ) ;\n          #endif\n        }\n        _watch_array(%d) = 3;\n      }else{\n        _watch_array(%d) = 2;\n      }\n    }\n"
                ,uVar16,pcVar11,uVar16,lVar18,lVar18,uVar16,uVar16);
        lappendstr(procfunc,buf);
        free(pcVar11);
        pLVar10 = pIVar7->next;
        uVar16 = (ulong)((int)uVar16 + 1);
      } while (pLVar10 != watch_data_);
    }
    buf._4_4_ = SUB84(buf._0_8_,4) & 0xffffff00;
    builtin_strncpy(buf,"  }\n",4);
    lappendstr(procfunc,buf);
    lappendstr(procfunc,
               "\n#if NET_RECEIVE_BUFFERING\n  NetSendBuffer_t* _nsb = _ml->_net_send_buffer;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc wait(stream_id)\n  #pragma acc update self(_nsb->_cnt) if(_nt->compute_gpu)\n  update_net_send_buffer_on_host(_nt, _nsb);\n#endif\n  {int _i;\n  for (_i=0; _i < _nsb->_cnt; ++_i) {\n    net_sem_from_gpu(_nsb->_sendtype[_i], _nsb->_vdata_index[_i],\n      _nsb->_weight_index[_i], _nt->_id, _nsb->_pnt_index[_i],\n      _nsb->_nsb_t[_i], _nsb->_nsb_flag[_i]);\n  }}\n  _nsb->_cnt = 0;\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\n  #pragma acc update device(_nsb->_cnt) if(_nt->compute_gpu)\n#endif\n#endif\n"
              );
    lappendstr(procfunc,"}\n");
  }
  lVar18 = 0x41;
  do {
    pLVar10 = symlist[lVar18]->next;
    if (pLVar10 != symlist[lVar18]) {
      do {
        if ((((pLVar10->element).sym)->subtype & 2) != 0) {
          warn_ignore((pLVar10->element).sym);
        }
        pLVar10 = pLVar10->next;
      } while (pLVar10 != symlist[lVar18]);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x7b);
  return;
}

Assistant:

void parout() {
	int i, j, ioncount, pointercount, gind, emit_check_table_thread;
	Item *q, *q1, *extra_pragma_loop_arg;
	Symbol *s, *sion;
	double d1, d2;

#if BBCORE
	cvode_emit = 0;
#endif

	defs_list = newlist();	/* relates hoc names to c-variables */
	if (brkpnt_exists) {
	    if (vectorize) {
		brkpnt_str_ = "nrn_cur, NULL, nrn_state";
	    }else{
		brkpnt_str_ = "nrn_cur, nrn_jacob, nrn_state";
	    }
	}else{
		brkpnt_str_ = "0, 0, 0";
#if 1 || defined(__MINGW32__)
		/* x86_64-w64-mingw32-gcc passed 0 without zeroing the high 32 bits */
		/* also cygwin64 gcc 4.8.1, so cast to void* universally */
		brkpnt_str_ = "NULL, NULL, NULL";
#endif
	}

	set_suffix();	

	if (artificial_cell && vectorize && (thread_data_index || toplocal_)) {
fprintf(stderr, "Notice: ARTIFICIAL_CELL models that would require thread specific data are not thread safe.\n");	
		vectorize = 0;
	}
	if (point_process) {
		rsuffix = "";
	}else{
		rsuffix = suffix;
	}

	if (point_process && !artificial_cell && net_receive_) {
	  	net_receive_buffering_ = 1;
		emit_net_receive_buffering_code();
	}

	Lappendstr(defs_list, "\
\n#include \"coreneuron/utils/randoms/nrnran123.h\"\
\n#include \"coreneuron/nrnoc/md1redef.h\"\
\n#include \"coreneuron/nrnconf.h\"\
\n#include \"coreneuron/sim/multicore.hpp\"\
\n#include \"coreneuron/nrniv/nrniv_decl.h\"\
\n#include \"coreneuron/utils/ivocvect.hpp\"\
\n#include \"coreneuron/utils/nrnoc_aux.hpp\"\
\n#include \"coreneuron/gpu/nrn_acc_manager.hpp\"\
\n#include \"coreneuron/sim/scopmath/newton_struct.h\"\
\n#include \"coreneuron/sim/scopmath/newton_thread.hpp\"\
\n#include \"coreneuron/sim/scopmath/sparse_thread.hpp\"\
\n#include \"coreneuron/sim/scopmath/ssimplic_thread.hpp\"\
\n#include \"coreneuron/nrnoc/md2redef.h\"\
\n#include \"coreneuron/mechanism/register_mech.hpp\"\
\n#if !NRNGPU\
\n#if !defined(DISABLE_HOC_EXP)\
\n#undef exp\
\n#define exp hoc_Exp\
\n#endif\
\n#endif\n\
");
	if (use_bbcorepointer) {
        Lappendstr(defs_list, "#define _threadargsproto_namespace int _iml, int _cntml_padded, double* _p, coreneuron::Datum* _ppvar, coreneuron::ThreadDatum* _thread, coreneuron::NrnThread* _nt, coreneuron::Memb_list* _ml, double v\n");

		lappendstr(defs_list, "static void bbcore_read(double *, int*, int*, int*, _threadargsproto_namespace);\n");
		lappendstr(defs_list, "static void bbcore_write(double *, int*, int*, int*, _threadargsproto_namespace);\n");
	}

	Lappendstr(defs_list, "namespace coreneuron {\n");
	if (vectorize) {
        /* macros for compiler dependent ivdep like pragma and memory layout. INIT and STATE pragma are same
         * except that sync clause absent because we saw issue only in CaDynamics_E2 */
		lappendstr(defs_list, "\
\n#if defined(_OPENACC) && !defined(DISABLE_OPENACC)\
\n#include <openacc.h>\
\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], nrn_ion_global_map[0:nrn_ion_global_map_size][0:ion_global_map_member_size], _nt[0:1] _thread_present_) if(_nt->compute_gpu)\")\
\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _nt[0:1], _ml[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1] _thread_present_) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"acc parallel loop present(_ni[0:_cntml_actual], _nt_data[0:_nt->_ndata], _p[0:_cntml_padded*_psize], _ppvar[0:_cntml_padded*_ppsize], _vec_v[0:_nt->end], _vec_shadow_rhs[0:_nt->shadow_rhs_cnt], _vec_shadow_d[0:_nt->shadow_rhs_cnt], _vec_d[0:_nt->end], _vec_rhs[0:_nt->end], _nt[0:1]) if(_nt->compute_gpu) async(stream_id)\")\
\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"acc parallel loop present(_pnt[0:_pnt_length], _nrb[0:1], _nt[0:1], nrn_threads[0:nrn_nthread]) if(_nt->compute_gpu) async(stream_id)\")\
\n#else\
\n#define _PRAGMA_FOR_INIT_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_STATE_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_CUR_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_CUR_SYN_ACC_LOOP_ _Pragma(\"\")\
\n#define _PRAGMA_FOR_NETRECV_ACC_LOOP_ _Pragma(\"\")\
\n#endif\
\n \
\n#if !defined(LAYOUT)\
\n/* 1 means AoS, >1 means AoSoA, <= 0 means SOA */\
\n#define LAYOUT 1\
\n#endif\
\n#if LAYOUT >= 1\
\n#define _STRIDE LAYOUT\
\n#else\
\n#define _STRIDE _cntml_padded + _iml\
\n#endif\
\n");

       // if protect is used then do not enable vectorisation with ivdep like pragmas
       // mod2c doesn't have fine grain mechanism to check where PROTECT appears (e.g. via AST)
       // and hence just disable vectorisation at the top level (usage of PROTECT is/would be rare
       // and not critical in mod2c anyway)
       if (protect_include_) {
           extra_pragma_loop_arg = insertstr(defs_list, "\n#define _PRAGMA_FOR_VECTOR_LOOP_\n");
       } else {
           extra_pragma_loop_arg = insertstr(defs_list, "\n"
               "\n#if defined(__ICC) || defined(__INTEL_COMPILER) || defined(__INTEL_LLVM_COMPILER)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ivdep\")"
               "\n#elif defined(__IBMC__) || defined(__IBMCPP__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"ibm independent_loop\")"
               "\n#elif defined(__PGI)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"vector\")"
               "\n#elif defined(_CRAYC)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"_CRI ivdep\")"
               "\n#elif defined(__clang__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"clang loop vectorize(enable)\")"
               "\n#elif defined(__GNUC__) || defined(__GNUG__)"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_ _Pragma(\"GCC ivdep\")"
               "\n#else"
               "\n#define _PRAGMA_FOR_VECTOR_LOOP_"
               "\n#endif // _PRAGMA_FOR_VECTOR_LOOP_\n");
       }

	}else{
		Lappendstr(defs_list, "\
\n#undef LAYOUT\
\n#define LAYOUT 1\
\n#define _STRIDE 1\
\n");
	}

	if (net_receive_buffering_) {
		Lappendstr(defs_list, "\
\n\
\n#if !defined(NET_RECEIVE_BUFFERING)\
\n#define NET_RECEIVE_BUFFERING 1\
\n#endif\
\n");
	}

#if 1
	/* for easier profiling, give distinct names to otherwise reused static names */
	sprintf(buf, "\n\
#define nrn_init _nrn_init_%s\n\
#define nrn_cur _nrn_cur_%s\n\
#define _nrn_current _nrn_current_%s\n\
#define nrn_jacob _nrn_jacob_%s\n\
#define nrn_state _nrn_state_%s\n\
#define initmodel initmodel_%s\n\
#define _net_receive _net_receive_%s\n\
#define _net_init _net_init_%s\n\
#define nrn_state_launcher nrn_state%s_launcher\n\
#define nrn_cur_launcher nrn_cur%s_launcher\n\
#define nrn_jacob_launcher nrn_jacob%s_launcher\
", suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix, suffix);
	Lappendstr(defs_list, buf);

	if (net_receive_buffering_) {
		sprintf(buf, "\
\n#if NET_RECEIVE_BUFFERING\
\n#define _net_buf_receive _net_buf_receive%s\
\nvoid _net_buf_receive(NrnThread*);\
\n#endif\
\n", suffix);
		Lappendstr(defs_list, buf);
	}

	if (watch_seen_) {
		sprintf(buf,
"\n#define _nrn_watch_check _nrn_watch_check_%s", suffix);
		Lappendstr(defs_list, buf);
	}

	SYMLISTITER {
		Symbol* s = SYM(q);
		/* note that with GLOBFUNCT, FUNCT will be redefined anyway */
		if (s->type == NAME && s->subtype & (PROCED | DERF | KINF)) {
			sprintf(buf, "\n#define %s %s%s", s->name, s->name, suffix);
			Lappendstr(defs_list, buf);
		}
	}
	Lappendstr(defs_list, "\n");
#endif /* distinct names for easier profiling */

	Lappendstr(defs_list, "\n\
#undef _threadargscomma_\n\
#undef _threadargsprotocomma_\n\
#undef _threadargs_\n\
#undef _threadargsproto_\n\
");
	if (vectorize) {
		Lappendstr(defs_list, "\n\
#define _threadargscomma_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v,\n\
#define _threadargsprotocomma_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v,\n\
#define _threadargs_ _iml, _cntml_padded, _p, _ppvar, _thread, _nt, _ml, v\n\
#define _threadargsproto_ int _iml, int _cntml_padded, double* _p, Datum* _ppvar, ThreadDatum* _thread, NrnThread* _nt, Memb_list* _ml, double v\n\
");
}else{
		Lappendstr(defs_list, "\n\
#define _threadargscomma_ /**/\n\
#define _threadargsprotocomma_ /**/\n\
#define _threadargs_ /**/\n\
#define _threadargsproto_ /**/\n\
");
}

	Lappendstr(defs_list, "\
	/*SUPPRESS 761*/\n\
	/*SUPPRESS 762*/\n\
	/*SUPPRESS 763*/\n\
	/*SUPPRESS 765*/\n\
	");
#if VECTORIZE
    if (vectorize) {
	Sprintf(buf, "/* Thread safe. No static _p or _ppvar. */\n");
    }else
#endif
    {
	Sprintf(buf, "static double *_p; static Datum *_ppvar;\n");
    }
	Lappendstr(defs_list, buf);

	nrndeclare();
	varcount = parraycount = 0;
	declare_p();
	ioncount = iondef(&pointercount); /* first is _nd_area if point process */
	Lappendstr(defs_list, "\n#if MAC\n#if !defined(v)\n#define v _mlhv\n#endif\n#if !defined(h)\n#define h _mlhh\n#endif\n#endif\n");
	Lappendstr(defs_list, "static int hoc_nrnpointerindex = ");
	if (pointercount) {
		q = nrnpointers->next;
		Sprintf(buf, "%d;\n", SYM(q)->used);
	}else{
		Sprintf(buf, "-1;\n");
	}
	Lappendstr(defs_list, buf);
	/*above modified to also count and define pointers*/
	
	if (vectorize) {
		Lappendstr(defs_list, "static ThreadDatum* _extcall_thread;\n");
	}
#if 0
	Lappendstr(defs_list, "/* static variables special to NEURON */\n");
	SYMLISTITER {
		if (SYM(q)->nrntype & NRNSTATIC) {
			Sprintf(buf, "static double %s;\n", SYM(q)->name);
			Lappendstr(defs_list, buf);
		}
	}
#endif

	Lappendstr(defs_list, "/* external NEURON variables */\n");
	int add_celsius  = 0;
	int redefine_nrn_ghk = 0;
	SYMLISTITER {
		s = SYM(q);
		if(strcmp(s->name, "nrn_ghk") == 0 && s->subtype & EXTDEF) {
			add_celsius = 1;
			redefine_nrn_ghk = 1;
		}
		if (s->nrntype & NRNEXTRN) {
			if (strcmp(s->name, "celsius") == 0) {
				add_celsius = 1;
				continue;
			}
			if (strcmp(s->name, "dt") == 0) { continue; }
			if (strcmp(s->name, "t") == 0) { continue; }
			if (s->subtype & ARRAY) {
				Sprintf(buf, "extern double* %s;\n", s->name);
			}else{
				Sprintf(buf, "extern double %s;\n", s->name);
			}
			Lappendstr(defs_list, buf);
			// following are remaining two global variables used as extern from
			// coreneuron side and hence add them to global variable list.
			if (strcmp(s->name, "secondorder") || strcmp(s->name, "pi"))  {
				add_global_var("double", s->name, 0, 0, 0, 0);
            }
        }
    }